

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

uint32 __thiscall
Js::ES5ArrayTypeHandlerBase<int>::DeleteDownTo
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 first,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  IndexPropertyDescriptorMap *pIVar7;
  uint local_34;
  uint local_30;
  uint32 lastIndex;
  uint32 oldLen;
  uint32 count;
  PropertyOperationFlags propertyOperationFlags_local;
  uint32 first_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  oldLen = propertyOperationFlags;
  count = first;
  _propertyOperationFlags_local = (ArrayObject *)arr;
  arr_local = (ES5Array *)this;
  uVar4 = ArrayObject::GetLength((ArrayObject *)arr);
  if (uVar4 <= first) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x3a6,"(first < arr->GetLength())","first < arr->GetLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = ArrayObject::GetLength(_propertyOperationFlags_local);
  lastIndex = uVar4 - count;
  if (lastIndex < 5) {
    local_30 = ArrayObject::GetLength(_propertyOperationFlags_local);
    while ((count < local_30 &&
           (iVar5 = (*(_propertyOperationFlags_local->super_DynamicObject).super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x2a])
                              (_propertyOperationFlags_local,(ulong)(local_30 - 1),(ulong)oldLen),
           iVar5 != 0))) {
      local_30 = local_30 - 1;
    }
    this_local._4_4_ = local_30;
  }
  else {
    bVar3 = GetDataItemAttributes(this);
    if ((bVar3 & 2) == 0) {
      pIVar7 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      bVar2 = IndexPropertyDescriptorMap::TryGetLastIndex(pIVar7,&local_34);
      if ((bVar2) && (count <= local_34)) {
        count = local_34 + 1;
      }
      bVar2 = TryGetLastDataItemIndex
                        (this,(ES5Array *)_propertyOperationFlags_local,count,&local_34);
      if (bVar2) {
        count = local_34 + 1;
      }
      this_local._4_4_ = count;
    }
    else {
      pIVar7 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      this_local._4_4_ = IndexPropertyDescriptorMap::DeleteDownTo(pIVar7,count);
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 ES5ArrayTypeHandlerBase<T>::DeleteDownTo(ES5Array* arr, uint32 first, PropertyOperationFlags propertyOperationFlags)
    {
        Assert(first < arr->GetLength()); // Only called when newLen < oldLen

        // If the number of elements to be deleted is small, iterate on it.
        uint32 count = arr->GetLength() - first;
        if (count < 5)
        {
            uint32 oldLen = arr->GetLength();
            while (first < oldLen)
            {
                if (!arr->DeleteItem(oldLen - 1, propertyOperationFlags))
                {
                    break;
                }
                --oldLen;
            }

            return oldLen;
        }

        // If data items are [[CanDelete]], check attribute map only.
        if (GetDataItemAttributes() & PropertyConfigurable)
        {
            return indexPropertyMap->DeleteDownTo(first);
        }
        else
        {
            // The array isSealed. No existing item can be deleted. Look for the max index.
            uint32 lastIndex;
            if (indexPropertyMap->TryGetLastIndex(&lastIndex) && lastIndex >= first)
            {
                first = lastIndex + 1;
            }
            if (TryGetLastDataItemIndex(arr, first, &lastIndex))
            {
                first = lastIndex + 1;
            }
            return first;
        }
    }